

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void probability_sort(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  ulong uVar1;
  bool bVar2;
  reference puVar3;
  size_type sVar4;
  reference pvVar5;
  allocator_type *__a;
  reference pvVar6;
  undefined8 in_RDI;
  uint *x;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  size_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> remap;
  uint *v;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  size_t i;
  vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_> elems;
  uint32_t max_elem;
  vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  value_type in_stack_fffffffffffffee4;
  __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
  in_stack_fffffffffffffee8;
  ulong uVar7;
  __normal_iterator<std::pair<long,_unsigned_long>_*,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>
  in_stack_fffffffffffffef0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffef8;
  undefined1 *__n;
  vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff00;
  vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_> *this;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c8;
  undefined8 local_c0;
  ulong local_b8;
  undefined1 local_a9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  pair<long,_unsigned_long> *local_90;
  pair<long,_unsigned_long> *local_88;
  reference local_80;
  uint *local_78;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  undefined8 local_68;
  ulong local_60;
  vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_> local_40;
  uint *local_28;
  uint *local_20;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18;
  uint local_c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_20 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffffed8);
  local_28 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffffed8);
  local_18 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (in_stack_fffffffffffffef8,
                        (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )in_stack_fffffffffffffef0._M_current);
  puVar3 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator*(&local_18);
  local_c = *puVar3;
  std::allocator<std::pair<long,_unsigned_long>_>::allocator
            ((allocator<std::pair<long,_unsigned_long>_> *)0x13048c);
  std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
  vector(in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8._M_current,
         (allocator_type *)in_stack_fffffffffffffef0._M_current);
  std::allocator<std::pair<long,_unsigned_long>_>::~allocator
            ((allocator<std::pair<long,_unsigned_long>_> *)0x1304b2);
  local_60 = 0;
  while( true ) {
    uVar7 = local_60;
    sVar4 = std::
            vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ::size(&local_40);
    uVar1 = local_60;
    if (sVar4 <= uVar7) break;
    pvVar5 = std::
             vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ::operator[](&local_40,local_60);
    pvVar5->second = uVar1;
    pvVar5 = std::
             vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ::operator[](&local_40,local_60);
    pvVar5->first = 0;
    local_60 = local_60 + 1;
  }
  local_68 = local_8;
  local_70._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffffed8);
  local_78 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffffed8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar2) break;
    local_80 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_70);
    pvVar5 = std::
             vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ::operator[](&local_40,(ulong)*local_80);
    pvVar5->first = pvVar5->first + -1;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_70);
  }
  this = &local_40;
  local_88 = (pair<long,_unsigned_long> *)
             std::
             vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ::begin(in_stack_fffffffffffffed8);
  local_90 = (pair<long,_unsigned_long> *)
             std::
             vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ::end(in_stack_fffffffffffffed8);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_long>*,std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  __a = (allocator_type *)(ulong)(local_c + 1);
  __n = &local_a9;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x13066b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x13068e);
  local_b8 = 0;
  while( true ) {
    uVar7 = local_b8;
    sVar4 = std::
            vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ::size(&local_40);
    if (sVar4 <= uVar7) break;
    in_stack_fffffffffffffee4 = (value_type)local_b8;
    pvVar5 = std::
             vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ::operator[](&local_40,local_b8);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_a8,pvVar5->second);
    *pvVar6 = in_stack_fffffffffffffee4;
    local_b8 = local_b8 + 1;
  }
  local_c0 = local_8;
  local_c8._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffffed8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar2) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_c8);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_a8,(ulong)*puVar3);
    *puVar3 = *pvVar6 + 1;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_c8);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
  ~vector((vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           *)__a);
  return;
}

Assistant:

void probability_sort(std::vector<uint32_t>& vec)
{
    uint32_t max_elem = *std::max_element(vec.begin(), vec.end());
    std::vector<std::pair<int64_t, uint64_t>> elems(max_elem + 1);
    for (size_t i = 0; i < elems.size(); i++) {
        elems[i].second = i;
        elems[i].first = 0;
    }
    for (const auto& v : vec)
        elems[v].first--;
    std::sort(elems.begin(), elems.end());
    std::vector<uint32_t> remap(max_elem + 1);
    for (size_t i = 0; i < elems.size(); i++) {
        remap[elems[i].second] = i;
    }
    for (auto& x : vec)
        x = remap[x] + 1;
}